

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::writeEmptyPacketWithPCR(TSMuxer *this,int64_t pcrVal)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference pvVar5;
  TSPacket *this_00;
  uint32_t *initTS;
  TSPacket *tsPacket;
  uint8_t *curBuf;
  int64_t pcrVal_local;
  TSMuxer *this_local;
  
  if ((this->m_m2tsMode & 1U) != 0) {
    this->m_outBufLen = this->m_outBufLen + 4;
    this->m_processedBlockSize = this->m_processedBlockSize + 4;
    this->m_pcrBits = this->m_pcrBits + 0x20;
  }
  this_00 = (TSPacket *)(this->m_outBuf + this->m_outBufLen);
  *(undefined4 *)this_00 = 0x47;
  this_00->adaptiveField = (AdaptiveField)0x1007;
  TSPacket::setPID(this_00,(this->m_pmt).pcr_pid);
  *(uint *)this_00 = *(uint *)this_00 & 0xdfffffff | 0x20000000;
  AdaptiveField::setPCR33(&this_00->adaptiveField,pcrVal);
  pmVar3 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](&this->m_streamInfo,&(this->m_pmt).pcr_pid);
  *(uint *)this_00 = *(uint *)this_00 & 0xf0ffffff | (pmVar3->m_tsCnt & 0xfU) << 0x18;
  iVar1 = TSPacket::getHeaderSize(this_00);
  iVar2 = TSPacket::getHeaderSize(this_00);
  memset(&this_00->field_0x0 + iVar1,0xff,(long)(0xbc - iVar2));
  iVar1 = TSPacket::getHeaderSize(this_00);
  *(ushort *)&this_00->adaptiveField =
       *(ushort *)&this_00->adaptiveField & 0xff00 |
       (*(ushort *)&this_00->adaptiveField & 0xff) + (0xbc - (short)iVar1) & 0xff;
  this->m_outBufLen = this->m_outBufLen + 0xbc;
  this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
  this->m_pcrBits = this->m_pcrBits + 0x5e0;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_muxedPacketCnt);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_muxedPacketCnt,sVar4 - 1);
  *pvVar5 = *pvVar5 + 1;
  if ((this->m_m2tsMode & 1U) != 0) {
    processM2TSPCR(this,pcrVal,0);
  }
  writeOutBuffer(this);
  return;
}

Assistant:

void TSMuxer::writeEmptyPacketWithPCR(const int64_t pcrVal)
{
    if (m_m2tsMode)
    {
        m_outBufLen += 4;
        m_processedBlockSize += 4;
        m_pcrBits += 4 * 8;
    }
    uint8_t* curBuf = m_outBuf + m_outBufLen;
    const auto tsPacket = reinterpret_cast<TSPacket*>(curBuf);
    const auto initTS = reinterpret_cast<uint32_t*>(curBuf);
    *initTS = TSPacket::TS_FRAME_SYNC_BYTE;
    initTS[1] = 0x07 + TSPacket::PCR_BIT_VAL;
    tsPacket->setPID(m_pmt.pcr_pid);
    tsPacket->afExists = 1;
    tsPacket->adaptiveField.setPCR33(pcrVal);
    tsPacket->counter = m_streamInfo[m_pmt.pcr_pid].m_tsCnt;  // do not increment counter becouse data_exists == 0

    memset(curBuf + tsPacket->getHeaderSize(), 0xff, TS_FRAME_SIZE - tsPacket->getHeaderSize());
    tsPacket->adaptiveField.length += TS_FRAME_SIZE - tsPacket->getHeaderSize();
    m_outBufLen += TS_FRAME_SIZE;
    m_processedBlockSize += TS_FRAME_SIZE;
    m_pcrBits += TS_FRAME_SIZE * 8;
    m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
    if (m_m2tsMode)
        processM2TSPCR(pcrVal, 0);
    writeOutBuffer();
}